

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

void __thiscall leveldb::VersionSet::Builder::SaveTo(Builder *this,Version *v)

{
  FileSet *pFVar1;
  size_type sVar2;
  size_type sVar3;
  _Rb_tree<leveldb::FileMetaData_*,_leveldb::FileMetaData_*,_std::_Identity<leveldb::FileMetaData_*>,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
  *this_00;
  FileMetaData *pFVar4;
  pointer pcVar5;
  bool bVar6;
  int iVar7;
  __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
  _Var8;
  _Base_ptr p_Var9;
  pointer ppFVar10;
  ulong uVar11;
  size_t *this_01;
  __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
  __first;
  ulong uVar12;
  long lVar13;
  InternalKeyComparator *pIVar14;
  InternalKey *pIVar15;
  long lVar16;
  InternalKey *pIVar17;
  InternalKey *pIVar18;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> vStack_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_c0;
  Version *pVStack_b8;
  long lStack_b0;
  InternalKey *pIStack_a8;
  Builder *pBStack_a0;
  InternalKey *pIStack_98;
  code *pcStack_90;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *local_80;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *local_78;
  LevelState *local_70;
  _Val_comp_iter<leveldb::VersionSet::Builder::BySmallestKey> local_68;
  __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
  local_60;
  _Rb_tree_node_base *local_58;
  pointer local_50;
  size_type local_48;
  pointer local_40;
  size_type local_38;
  
  local_68._M_comp.internal_comparator = (BySmallestKey)&this->vset_->icmp_;
  local_70 = this->levels_;
  local_78 = v->files_;
  lVar16 = 0;
  do {
    __first._M_current =
         this->base_->files_[lVar16].
         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    _Var8._M_current =
         this->base_->files_[lVar16].
         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    pFVar1 = local_70[lVar16].added_files;
    local_80 = local_78 + lVar16;
    pcStack_90 = (code *)0x1226c2;
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::reserve
              (local_80,((long)_Var8._M_current - (long)__first._M_current >> 3) +
                        (pFVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count);
    p_Var9 = (pFVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_58 = &(pFVar1->_M_t)._M_impl.super__Rb_tree_header._M_header;
    iVar7 = (int)lVar16;
    if (p_Var9 != local_58) {
      do {
        local_60._M_current = _Var8._M_current;
        pcStack_90 = (code *)0x1226f0;
        _Var8 = std::
                __upper_bound<__gnu_cxx::__normal_iterator<leveldb::FileMetaData*const*,std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>>,leveldb::FileMetaData*,__gnu_cxx::__ops::_Val_comp_iter<leveldb::VersionSet::Builder::BySmallestKey>>
                          (__first,local_60,(FileMetaData **)(p_Var9 + 1),local_68);
        for (; __first._M_current != _Var8._M_current; __first._M_current = __first._M_current + 1)
        {
          pcStack_90 = (code *)0x12270a;
          MaybeAddFile(this,v,iVar7,*__first._M_current);
        }
        pcStack_90 = (code *)0x122725;
        MaybeAddFile(this,v,iVar7,*(FileMetaData **)(p_Var9 + 1));
        pcStack_90 = (code *)0x12272d;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        _Var8._M_current = local_60._M_current;
      } while (p_Var9 != local_58);
    }
    for (; __first._M_current != _Var8._M_current; __first._M_current = __first._M_current + 1) {
      pcStack_90 = (code *)0x122750;
      MaybeAddFile(this,v,iVar7,*__first._M_current);
    }
    if ((lVar16 != 0) &&
       (ppFVar10 = (local_80->
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   )._M_impl.super__Vector_impl_data._M_start,
       8 < (ulong)((long)(local_80->
                         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar10))) {
      uVar11 = 1;
      uVar12 = 2;
      do {
        sVar2 = (ppFVar10[(int)uVar12 - 2]->largest).rep_._M_string_length;
        if (sVar2 == 0) {
LAB_0012281c:
          pcStack_90 = (code *)0x12283b;
          __assert_fail("!rep_.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./db/dbformat.h"
                        ,0x96,"Slice leveldb::InternalKey::Encode() const");
        }
        pIVar18 = &ppFVar10[(int)uVar12 - 2]->largest;
        local_40 = (pIVar18->rep_)._M_dataplus._M_p;
        sVar3 = (ppFVar10[uVar11]->smallest).rep_._M_string_length;
        local_38 = sVar2;
        if (sVar3 == 0) goto LAB_0012281c;
        pIVar17 = &ppFVar10[uVar11]->smallest;
        pIVar14 = &this->vset_->icmp_;
        local_50 = (pIVar17->rep_)._M_dataplus._M_p;
        pcStack_90 = (code *)0x1227e0;
        local_48 = sVar3;
        iVar7 = (*(pIVar14->super_Comparator)._vptr_Comparator[2])(pIVar14,&local_40,&local_50);
        if (-1 < iVar7) {
          pcStack_90 = ~Builder;
          pIVar15 = pIVar18;
          SaveTo();
          paStack_c0 = &(pIVar15->rep_).field_2;
          lVar13 = 0;
          pVStack_b8 = v;
          lStack_b0 = lVar16;
          pIStack_a8 = pIVar17;
          pBStack_a0 = this;
          pIStack_98 = pIVar18;
          pcStack_90 = (code *)uVar12;
          do {
            this_00 = (_Rb_tree<leveldb::FileMetaData_*,_leveldb::FileMetaData_*,_std::_Identity<leveldb::FileMetaData_*>,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
                       *)(&paStack_c0->_M_allocated_capacity)[lVar13 * 7 + 6];
            vStack_e0.
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_start = (FileMetaData **)0x0;
            vStack_e0.
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = (FileMetaData **)0x0;
            vStack_e0.
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (FileMetaData **)0x0;
            std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::reserve
                      (&vStack_e0,(this_00->_M_impl).super__Rb_tree_header._M_node_count);
            for (p_Var9 = (this_00->_M_impl).super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var9 != &(this_00->_M_impl).super__Rb_tree_header;
                p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
              if (vStack_e0.
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  vStack_e0.
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
                _M_realloc_insert<leveldb::FileMetaData*const&>
                          ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)
                           &vStack_e0,
                           (iterator)
                           vStack_e0.
                           super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(FileMetaData **)(p_Var9 + 1))
                ;
              }
              else {
                *vStack_e0.
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish = *(FileMetaData **)(p_Var9 + 1);
                vStack_e0.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     vStack_e0.
                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            std::
            _Rb_tree<leveldb::FileMetaData_*,_leveldb::FileMetaData_*,_std::_Identity<leveldb::FileMetaData_*>,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
            ::_M_erase(this_00,(_Link_type)
                               (this_00->_M_impl).super__Rb_tree_header._M_header._M_parent);
            operator_delete(this_00);
            if (vStack_e0.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                vStack_e0.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar11 = 0;
              uVar12 = 1;
              do {
                pFVar4 = vStack_e0.
                         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar11];
                iVar7 = pFVar4->refs;
                pFVar4->refs = iVar7 + -1;
                if (iVar7 < 2) {
                  pcVar5 = (pFVar4->largest).rep_._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar5 != &(pFVar4->largest).rep_.field_2) {
                    operator_delete(pcVar5);
                  }
                  pcVar5 = (pFVar4->smallest).rep_._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar5 != &(pFVar4->smallest).rep_.field_2) {
                    operator_delete(pcVar5);
                  }
                  operator_delete(pFVar4);
                }
                bVar6 = uVar12 < (ulong)((long)vStack_e0.
                                               super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)vStack_e0.
                                               super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 3);
                uVar11 = uVar12;
                uVar12 = (ulong)((int)uVar12 + 1);
              } while (bVar6);
            }
            if (vStack_e0.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (FileMetaData **)0x0) {
              operator_delete(vStack_e0.
                              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != 7);
          Version::Unref((Version *)(pIVar15->rep_)._M_string_length);
          this_01 = (size_t *)(pIVar15 + 0xb);
          lVar16 = -0x188;
          do {
            std::
            _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
            ::_M_erase((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)this_01,(_Link_type)this_01[2]);
            this_01 = this_01 + -7;
            lVar16 = lVar16 + 0x38;
          } while (lVar16 != 0);
          return;
        }
        ppFVar10 = (local_80->
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        bVar6 = uVar12 < (ulong)((long)(local_80->
                                       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar10
                                >> 3);
        uVar11 = uVar12;
        uVar12 = (ulong)((int)uVar12 + 1);
      } while (bVar6);
    }
    lVar16 = lVar16 + 1;
    if (lVar16 == 7) {
      return;
    }
  } while( true );
}

Assistant:

void SaveTo(Version* v) {
    BySmallestKey cmp;
    cmp.internal_comparator = &vset_->icmp_;
    for (int level = 0; level < config::kNumLevels; level++) {
      // Merge the set of added files with the set of pre-existing files.
      // Drop any deleted files.  Store the result in *v.
      const std::vector<FileMetaData*>& base_files = base_->files_[level];
      std::vector<FileMetaData*>::const_iterator base_iter = base_files.begin();
      std::vector<FileMetaData*>::const_iterator base_end = base_files.end();
      const FileSet* added_files = levels_[level].added_files;
      v->files_[level].reserve(base_files.size() + added_files->size());
      for (const auto& added_file : *added_files) {
        // Add all smaller files listed in base_
        for (std::vector<FileMetaData*>::const_iterator bpos =
                 std::upper_bound(base_iter, base_end, added_file, cmp);
             base_iter != bpos; ++base_iter) {
          MaybeAddFile(v, level, *base_iter);
        }

        MaybeAddFile(v, level, added_file);
      }

      // Add remaining base files
      for (; base_iter != base_end; ++base_iter) {
        MaybeAddFile(v, level, *base_iter);
      }

#ifndef NDEBUG
      // Make sure there is no overlap in levels > 0
      if (level > 0) {
        for (uint32_t i = 1; i < v->files_[level].size(); i++) {
          const InternalKey& prev_end = v->files_[level][i - 1]->largest;
          const InternalKey& this_begin = v->files_[level][i]->smallest;
          if (vset_->icmp_.Compare(prev_end, this_begin) >= 0) {
            std::fprintf(stderr, "overlapping ranges in same level %s vs. %s\n",
                         prev_end.DebugString().c_str(),
                         this_begin.DebugString().c_str());
            std::abort();
          }
        }
      }
#endif
    }
  }